

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void add_intrinsic_mul(Context_conflict *ctx,char *fn)

{
  int iVar1;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_astDataType *pMVar4;
  MOJOSHADER_astDataType *pMVar5;
  void *value;
  MOJOSHADER_astDataType *local_198;
  MOJOSHADER_astDataType *local_190;
  MOJOSHADER_astDataType *local_180;
  MOJOSHADER_astDataType *local_178;
  MOJOSHADER_astDataType *local_170;
  MOJOSHADER_astDataType *local_168;
  MOJOSHADER_astDataType *local_160;
  MOJOSHADER_astDataType *local_158;
  MOJOSHADER_astDataType *local_150;
  MOJOSHADER_astDataType *local_148;
  MOJOSHADER_astDataType *local_140;
  MOJOSHADER_astDataType *local_138;
  MOJOSHADER_astDataType *local_130;
  MOJOSHADER_astDataType *local_128;
  MOJOSHADER_astDataType *local_120;
  MOJOSHADER_astDataType *local_118;
  MOJOSHADER_astDataType *local_110;
  MOJOSHADER_astDataType *local_108;
  MOJOSHADER_astDataType *local_100;
  MOJOSHADER_astDataType *local_f8;
  MOJOSHADER_astDataType *local_f0;
  MOJOSHADER_astDataType *local_e8;
  MOJOSHADER_astDataType *local_e0;
  MOJOSHADER_astDataType *local_d8;
  MOJOSHADER_astDataType *local_d0;
  MOJOSHADER_astDataType *local_c8;
  MOJOSHADER_astDataType *local_c0;
  MOJOSHADER_astDataType *local_b8;
  MOJOSHADER_astDataType *local_b0;
  MOJOSHADER_astDataType *local_a8;
  MOJOSHADER_astDataType *local_a0;
  MOJOSHADER_astDataType *local_98;
  MOJOSHADER_astDataType *local_90;
  MOJOSHADER_astDataType *local_88;
  MOJOSHADER_astDataType *local_80;
  MOJOSHADER_astDataType *local_78;
  MOJOSHADER_astDataType *local_70;
  MOJOSHADER_astDataType *local_68;
  MOJOSHADER_astDataType *local_60;
  MOJOSHADER_astDataType *local_58;
  MOJOSHADER_astDataType *local_50;
  MOJOSHADER_astDataType *local_48;
  MOJOSHADER_astDataType *local_40;
  MOJOSHADER_astDataType *local_38;
  
  iVar1 = hash_find((ctx->usertypes).hash,"float1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_128 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_128 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_58 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_58 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_60 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_60 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_40 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_40 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_130 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_130 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_48 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_48 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_80 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_80 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_50 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_50 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float1x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_e0 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_e0 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float1x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_e8 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_e8 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float1x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_88 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_88 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float1x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_138 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_138 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float2x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_140 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_140 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float2x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_90 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_90 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float2x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_f0 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_f0 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float2x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_98 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_98 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float3x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_f8 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_f8 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float3x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_a0 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_a0 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float3x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_148 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_148 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float3x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_150 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_150 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float4x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_158 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_158 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float4x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_70 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_70 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float4x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_a8 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_a8 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float4x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_100 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_100 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int1x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_160 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_160 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int1x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_b0 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_b0 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int1x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_b8 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_b8 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int1x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_108 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_108 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int2x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_168 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_168 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int2x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_c0 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_c0 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int2x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_110 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_110 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int2x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_c8 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_c8 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int3x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_118 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_118 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int3x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_d0 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_d0 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int3x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_170 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_170 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int3x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_178 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_178 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int4x1",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_180 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_180 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int4x2",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_78 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_78 = (local_198->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"int4x3",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_d8 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_d8 = (local_198->array).base;
  }
  pMVar4 = &ctx->dt_float;
  local_68 = &ctx->dt_int;
  iVar1 = hash_find((ctx->usertypes).hash,"int4x4",&local_198);
  if ((iVar1 == 0) || (local_198 == (MOJOSHADER_astDataType *)0x0)) {
    local_120 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_120 = (local_198->array).base;
  }
  local_198 = local_68;
  local_190 = local_68;
  pMVar2 = build_function_datatype(ctx,local_68,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1",&local_198);
  pMVar2 = local_68;
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = local_68;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_190 = pMVar2;
  local_198 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar5 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar5 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar5 = (local_198->array).base;
    }
  }
  local_198 = pMVar5;
  local_190 = pMVar5;
  local_38 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_130;
  local_198 = local_130;
  local_190 = local_160;
  pMVar5 = build_function_datatype(ctx,local_130,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar2 = local_48;
  local_198 = pMVar4;
  local_190 = local_b0;
  pMVar5 = build_function_datatype(ctx,local_48,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_b8;
  pMVar5 = build_function_datatype(ctx,local_80,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_50;
  local_198 = pMVar4;
  local_190 = local_108;
  local_130 = pMVar4;
  pMVar3 = build_function_datatype(ctx,local_50,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_168;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = local_c0;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_80;
  local_198 = pMVar2;
  local_190 = local_110;
  pMVar3 = build_function_datatype(ctx,local_80,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_c8;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_118;
  pMVar3 = build_function_datatype(ctx,local_130,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_d0;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_170;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_178;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_180;
  pMVar3 = build_function_datatype(ctx,local_130,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_78;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_d8;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = local_120;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_128;
  local_198 = local_128;
  local_190 = local_e0;
  pMVar5 = build_function_datatype(ctx,local_128,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_58;
  local_198 = pMVar4;
  local_190 = local_e8;
  pMVar2 = build_function_datatype(ctx,local_58,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_88;
  pMVar2 = build_function_datatype(ctx,local_60,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  pMVar2 = local_40;
  local_198 = pMVar4;
  local_190 = local_138;
  local_128 = pMVar4;
  pMVar3 = build_function_datatype(ctx,local_40,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_140;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = local_90;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_60;
  local_198 = pMVar5;
  local_190 = local_f0;
  pMVar3 = build_function_datatype(ctx,local_60,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_98;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_f8;
  pMVar3 = build_function_datatype(ctx,local_128,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_a0;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_148;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_150;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_158;
  pMVar3 = build_function_datatype(ctx,local_128,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_70;
  pMVar5 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_a8;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = local_100;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x1",&local_198);
  pMVar5 = local_38;
  pMVar4 = local_68;
  if (iVar1 == 0) {
    local_198 = (MOJOSHADER_astDataType *)0x0;
  }
  else if (local_198 == (MOJOSHADER_astDataType *)0x0) {
    local_198 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_198 = (local_198->array).base;
  }
  local_190 = local_68;
  pMVar3 = build_function_datatype(ctx,local_198,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"int4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar2 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar3,0);
  iVar1 = hash_find((ctx->usertypes).hash,"uint4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar2 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar2 = (local_198->array).base;
    }
  }
  local_190 = pMVar4;
  local_198 = pMVar2;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"float4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"half4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double1x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double2x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double3x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x1",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x2",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x3",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  pMVar4 = (MOJOSHADER_astDataType *)0x0;
  push_function(ctx,fn,pMVar2,0);
  iVar1 = hash_find((ctx->usertypes).hash,"double4x4",&local_198);
  if (iVar1 != 0) {
    if (local_198 == (MOJOSHADER_astDataType *)0x0) {
      pMVar4 = (MOJOSHADER_astDataType *)0x0;
    }
    else {
      pMVar4 = (local_198->array).base;
    }
  }
  local_190 = pMVar5;
  local_198 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_130;
  local_198 = local_160;
  local_190 = local_130;
  pMVar5 = build_function_datatype(ctx,local_130,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar2 = local_48;
  local_198 = local_b0;
  local_190 = local_48;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = local_b8;
  local_190 = local_80;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_50;
  local_198 = local_108;
  local_190 = local_50;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_168;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_c0;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_80;
  local_198 = local_110;
  local_190 = local_80;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_c8;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_118;
  local_190 = local_130;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_d0;
  local_190 = pMVar2;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_170;
  local_190 = pMVar4;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_178;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_180;
  local_190 = local_130;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = local_78;
  local_190 = pMVar2;
  pMVar2 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = local_d8;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_120;
  local_190 = pMVar5;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_128;
  local_198 = local_e0;
  local_190 = local_128;
  pMVar5 = build_function_datatype(ctx,local_128,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = local_e8;
  local_190 = local_58;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_60;
  local_198 = local_88;
  local_190 = local_60;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  pMVar3 = local_40;
  local_198 = local_138;
  local_190 = local_40;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  pMVar2 = local_58;
  local_198 = local_140;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,local_58,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_90;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_f0;
  local_190 = pMVar5;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_98;
  local_190 = pMVar3;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_f8;
  local_190 = local_128;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_a0;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_148;
  local_190 = pMVar5;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_150;
  local_190 = pMVar3;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_158;
  local_190 = local_128;
  pMVar4 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_70;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_a8;
  local_190 = pMVar5;
  pMVar4 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = local_100;
  local_190 = pMVar3;
  pMVar4 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_160;
  local_198 = local_160;
  local_190 = local_160;
  pMVar5 = build_function_datatype(ctx,local_160,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar2 = local_b0;
  local_198 = pMVar4;
  local_190 = local_b0;
  pMVar5 = build_function_datatype(ctx,local_b0,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_b8;
  local_198 = pMVar4;
  local_190 = local_b8;
  pMVar3 = build_function_datatype(ctx,local_b8,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_108;
  pMVar3 = build_function_datatype(ctx,local_108,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_168;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = local_c0;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = local_110;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_108;
  local_198 = pMVar2;
  local_190 = local_c8;
  pMVar3 = build_function_datatype(ctx,local_108,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_118;
  pMVar3 = build_function_datatype(ctx,local_160,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_d0;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_170;
  pMVar2 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_178;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_180;
  pMVar5 = build_function_datatype(ctx,local_160,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar3 = local_b0;
  local_198 = pMVar4;
  local_190 = local_78;
  pMVar5 = build_function_datatype(ctx,local_b0,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_b8;
  local_198 = pMVar4;
  local_190 = local_d8;
  pMVar2 = build_function_datatype(ctx,local_b8,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_120;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_168;
  local_198 = local_168;
  local_190 = local_160;
  pMVar2 = build_function_datatype(ctx,local_168,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  pMVar2 = local_c0;
  local_198 = pMVar4;
  local_190 = pMVar3;
  pMVar3 = build_function_datatype(ctx,local_c0,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar5 = build_function_datatype(ctx,local_110,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_c8;
  local_198 = pMVar4;
  local_190 = local_108;
  pMVar3 = build_function_datatype(ctx,local_c8,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_110;
  local_198 = pMVar2;
  local_190 = local_110;
  pMVar3 = build_function_datatype(ctx,local_110,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_118;
  pMVar3 = build_function_datatype(ctx,local_168,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_d0;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_170;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_178;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_180;
  pMVar3 = build_function_datatype(ctx,local_168,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_78;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_d8;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = local_120;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_118;
  local_198 = local_118;
  local_190 = local_160;
  pMVar5 = build_function_datatype(ctx,local_118,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar2 = local_d0;
  local_198 = pMVar4;
  local_190 = local_b0;
  pMVar5 = build_function_datatype(ctx,local_d0,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_b8;
  pMVar5 = build_function_datatype(ctx,local_170,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_108;
  pMVar5 = build_function_datatype(ctx,local_178,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_168;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_c0;
  pMVar5 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_170;
  local_198 = pMVar2;
  local_190 = local_110;
  pMVar3 = build_function_datatype(ctx,local_170,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_c8;
  pMVar3 = build_function_datatype(ctx,local_178,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_178;
  local_198 = pMVar5;
  local_190 = local_178;
  pMVar5 = build_function_datatype(ctx,local_178,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_180;
  pMVar5 = build_function_datatype(ctx,local_118,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar3 = local_78;
  local_198 = pMVar4;
  local_190 = local_78;
  pMVar5 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_d8;
  local_198 = pMVar4;
  local_190 = local_d8;
  pMVar2 = build_function_datatype(ctx,local_170,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_120;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_180;
  local_198 = local_180;
  local_190 = local_160;
  pMVar2 = build_function_datatype(ctx,local_180,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_b0;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_b8;
  pMVar5 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_108;
  pMVar5 = build_function_datatype(ctx,local_120,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar3;
  local_190 = local_168;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar3;
  local_190 = local_c0;
  pMVar4 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar5 = local_d8;
  local_198 = pMVar3;
  local_190 = local_110;
  pMVar4 = build_function_datatype(ctx,local_d8,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_120;
  local_198 = pMVar3;
  local_190 = local_c8;
  pMVar2 = build_function_datatype(ctx,local_120,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_118;
  pMVar2 = build_function_datatype(ctx,local_180,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_d0;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_170;
  pMVar2 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_178;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_180;
  pMVar2 = build_function_datatype(ctx,local_180,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar5 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar5 = local_e0;
  local_198 = local_e0;
  local_190 = local_e0;
  pMVar4 = build_function_datatype(ctx,local_e0,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_e8;
  local_198 = pMVar5;
  local_190 = local_e8;
  pMVar2 = build_function_datatype(ctx,local_e8,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  pMVar2 = local_88;
  local_198 = pMVar5;
  local_190 = local_88;
  pMVar3 = build_function_datatype(ctx,local_88,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_138;
  pMVar3 = build_function_datatype(ctx,local_138,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_140;
  pMVar5 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_90;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_f0;
  pMVar5 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_98;
  pMVar5 = build_function_datatype(ctx,local_138,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_f8;
  pMVar5 = build_function_datatype(ctx,local_e0,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_a0;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = local_148;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_138;
  local_198 = pMVar2;
  local_190 = local_150;
  pMVar5 = build_function_datatype(ctx,local_138,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_e0;
  local_198 = pMVar4;
  local_190 = local_158;
  pMVar3 = build_function_datatype(ctx,local_e0,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_70;
  pMVar3 = build_function_datatype(ctx,local_e8,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_a8;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_100;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_140;
  local_198 = local_140;
  local_190 = pMVar5;
  pMVar5 = build_function_datatype(ctx,local_140,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar2 = local_90;
  local_198 = pMVar4;
  local_190 = local_e8;
  pMVar5 = build_function_datatype(ctx,local_90,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_88;
  pMVar5 = build_function_datatype(ctx,local_f0,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_98;
  local_198 = pMVar4;
  local_190 = local_138;
  pMVar3 = build_function_datatype(ctx,local_98,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar2;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_f0;
  local_198 = pMVar2;
  local_190 = local_f0;
  pMVar3 = build_function_datatype(ctx,local_f0,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = pMVar5;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_f8;
  pMVar3 = build_function_datatype(ctx,local_140,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_a0;
  pMVar3 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_148;
  pMVar3 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar4;
  local_190 = local_150;
  pMVar3 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_158;
  pMVar3 = build_function_datatype(ctx,local_140,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = local_70;
  pMVar2 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_a8;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = local_100;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_f8;
  local_198 = local_f8;
  local_190 = local_e0;
  pMVar5 = build_function_datatype(ctx,local_f8,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar2 = local_a0;
  local_198 = pMVar4;
  local_190 = local_e8;
  pMVar5 = build_function_datatype(ctx,local_a0,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_88;
  pMVar5 = build_function_datatype(ctx,local_148,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_138;
  pMVar5 = build_function_datatype(ctx,local_150,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_140;
  pMVar5 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar2;
  local_190 = local_90;
  pMVar5 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_148;
  local_198 = pMVar2;
  local_190 = local_f0;
  pMVar3 = build_function_datatype(ctx,local_148,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar2;
  local_190 = local_98;
  pMVar3 = build_function_datatype(ctx,local_150,2,&local_198,1);
  push_function(ctx,fn,pMVar3,0);
  local_198 = pMVar5;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = pMVar2;
  pMVar4 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar5;
  local_190 = pMVar5;
  pMVar4 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_150;
  local_198 = pMVar5;
  local_190 = local_150;
  pMVar5 = build_function_datatype(ctx,local_150,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_158;
  pMVar5 = build_function_datatype(ctx,local_f8,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar3 = local_70;
  local_198 = pMVar4;
  local_190 = local_70;
  pMVar5 = build_function_datatype(ctx,pMVar2,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  pMVar5 = local_a8;
  local_198 = pMVar4;
  local_190 = local_a8;
  pMVar2 = build_function_datatype(ctx,local_148,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_100;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_158;
  local_198 = local_158;
  local_190 = local_e0;
  pMVar2 = build_function_datatype(ctx,local_158,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_e8;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_88;
  pMVar5 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = local_138;
  pMVar5 = build_function_datatype(ctx,local_100,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar3;
  local_190 = local_140;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  local_198 = pMVar3;
  local_190 = local_90;
  pMVar4 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar5 = local_a8;
  local_198 = pMVar3;
  local_190 = local_f0;
  pMVar4 = build_function_datatype(ctx,local_a8,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  pMVar4 = local_100;
  local_198 = pMVar3;
  local_190 = local_98;
  pMVar2 = build_function_datatype(ctx,local_100,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_f8;
  pMVar2 = build_function_datatype(ctx,local_158,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_a0;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_148;
  pMVar2 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar5;
  local_190 = local_150;
  pMVar2 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = local_158;
  pMVar2 = build_function_datatype(ctx,local_158,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = pMVar3;
  pMVar2 = build_function_datatype(ctx,pMVar3,2,&local_198,1);
  push_function(ctx,fn,pMVar2,0);
  local_198 = pMVar4;
  local_190 = pMVar5;
  pMVar5 = build_function_datatype(ctx,pMVar5,2,&local_198,1);
  push_function(ctx,fn,pMVar5,0);
  local_198 = pMVar4;
  local_190 = pMVar4;
  pMVar4 = build_function_datatype(ctx,pMVar4,2,&local_198,1);
  push_function(ctx,fn,pMVar4,0);
  return;
}

Assistant:

static void add_intrinsic_mul(Context *ctx, const char *fn)
{
    // mul() is nasty, since there's a bunch of overloads that aren't just
    //  related to vector size.
    // !!! FIXME: needs half, double, uint...
    const MOJOSHADER_astDataType *dtf = &ctx->dt_float;
    const MOJOSHADER_astDataType *dti = &ctx->dt_int;
    const MOJOSHADER_astDataType *f1 = get_usertype(ctx, "float1");
    const MOJOSHADER_astDataType *f2 = get_usertype(ctx, "float2");
    const MOJOSHADER_astDataType *f3 = get_usertype(ctx, "float3");
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    const MOJOSHADER_astDataType *i1 = get_usertype(ctx, "int1");
    const MOJOSHADER_astDataType *i2 = get_usertype(ctx, "int2");
    const MOJOSHADER_astDataType *i3 = get_usertype(ctx, "int3");
    const MOJOSHADER_astDataType *i4 = get_usertype(ctx, "int4");
    const MOJOSHADER_astDataType *f1x1 = get_usertype(ctx, "float1x1");
    const MOJOSHADER_astDataType *f1x2 = get_usertype(ctx, "float1x2");
    const MOJOSHADER_astDataType *f1x3 = get_usertype(ctx, "float1x3");
    const MOJOSHADER_astDataType *f1x4 = get_usertype(ctx, "float1x4");
    const MOJOSHADER_astDataType *f2x1 = get_usertype(ctx, "float2x1");
    const MOJOSHADER_astDataType *f2x2 = get_usertype(ctx, "float2x2");
    const MOJOSHADER_astDataType *f2x3 = get_usertype(ctx, "float2x3");
    const MOJOSHADER_astDataType *f2x4 = get_usertype(ctx, "float2x4");
    const MOJOSHADER_astDataType *f3x1 = get_usertype(ctx, "float3x1");
    const MOJOSHADER_astDataType *f3x2 = get_usertype(ctx, "float3x2");
    const MOJOSHADER_astDataType *f3x3 = get_usertype(ctx, "float3x3");
    const MOJOSHADER_astDataType *f3x4 = get_usertype(ctx, "float3x4");
    const MOJOSHADER_astDataType *f4x1 = get_usertype(ctx, "float4x1");
    const MOJOSHADER_astDataType *f4x2 = get_usertype(ctx, "float4x2");
    const MOJOSHADER_astDataType *f4x3 = get_usertype(ctx, "float4x3");
    const MOJOSHADER_astDataType *f4x4 = get_usertype(ctx, "float4x4");
    const MOJOSHADER_astDataType *i1x1 = get_usertype(ctx, "int1x1");
    const MOJOSHADER_astDataType *i1x2 = get_usertype(ctx, "int1x2");
    const MOJOSHADER_astDataType *i1x3 = get_usertype(ctx, "int1x3");
    const MOJOSHADER_astDataType *i1x4 = get_usertype(ctx, "int1x4");
    const MOJOSHADER_astDataType *i2x1 = get_usertype(ctx, "int2x1");
    const MOJOSHADER_astDataType *i2x2 = get_usertype(ctx, "int2x2");
    const MOJOSHADER_astDataType *i2x3 = get_usertype(ctx, "int2x3");
    const MOJOSHADER_astDataType *i2x4 = get_usertype(ctx, "int2x4");
    const MOJOSHADER_astDataType *i3x1 = get_usertype(ctx, "int3x1");
    const MOJOSHADER_astDataType *i3x2 = get_usertype(ctx, "int3x2");
    const MOJOSHADER_astDataType *i3x3 = get_usertype(ctx, "int3x3");
    const MOJOSHADER_astDataType *i3x4 = get_usertype(ctx, "int3x4");
    const MOJOSHADER_astDataType *i4x1 = get_usertype(ctx, "int4x1");
    const MOJOSHADER_astDataType *i4x2 = get_usertype(ctx, "int4x2");
    const MOJOSHADER_astDataType *i4x3 = get_usertype(ctx, "int4x3");
    const MOJOSHADER_astDataType *i4x4 = get_usertype(ctx, "int4x4");

    // scalar * scalar
    add_intrinsic2(ctx, fn, dti, dti, dti);
    add_intrinsic2(ctx, fn, dtf, dtf, dtf);

    // scalar * vector
    ADD_INTRINSIC_VECTOR_INT(add_intrinsic2(ctx, fn, dt, dti, dt));
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic2(ctx, fn, dt, dtf, dt));

    // scalar * matrix
    ADD_INTRINSIC_MATRIX_INT(add_intrinsic2(ctx, fn, dt, dti, dt));
    ADD_INTRINSIC_MATRIX_FLOAT(add_intrinsic2(ctx, fn, dt, dtf, dt));

    // vector * scalar
    ADD_INTRINSIC_VECTOR_INT(add_intrinsic2(ctx, fn, dt, dt, dti));
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic2(ctx, fn, dt, dt, dtf));

    // vector * vector
    ADD_INTRINSIC_VECTOR_INT(add_intrinsic2(ctx, fn, dti, dt, dt));
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic2(ctx, fn, dtf, dt, dt));

    // vector * matrix
    add_intrinsic2(ctx, fn, i1, i1, i1x1);
    add_intrinsic2(ctx, fn, i2, i1, i1x2);
    add_intrinsic2(ctx, fn, i3, i1, i1x3);
    add_intrinsic2(ctx, fn, i4, i1, i1x4);
    add_intrinsic2(ctx, fn, i1, i2, i2x1);
    add_intrinsic2(ctx, fn, i2, i2, i2x2);
    add_intrinsic2(ctx, fn, i3, i2, i2x3);
    add_intrinsic2(ctx, fn, i4, i2, i2x4);
    add_intrinsic2(ctx, fn, i1, i3, i3x1);
    add_intrinsic2(ctx, fn, i2, i3, i3x2);
    add_intrinsic2(ctx, fn, i3, i3, i3x3);
    add_intrinsic2(ctx, fn, i4, i3, i3x4);
    add_intrinsic2(ctx, fn, i1, i4, i4x1);
    add_intrinsic2(ctx, fn, i2, i4, i4x2);
    add_intrinsic2(ctx, fn, i3, i4, i4x3);
    add_intrinsic2(ctx, fn, i4, i4, i4x4);
    add_intrinsic2(ctx, fn, f1, f1, f1x1);
    add_intrinsic2(ctx, fn, f2, f1, f1x2);
    add_intrinsic2(ctx, fn, f3, f1, f1x3);
    add_intrinsic2(ctx, fn, f4, f1, f1x4);
    add_intrinsic2(ctx, fn, f1, f2, f2x1);
    add_intrinsic2(ctx, fn, f2, f2, f2x2);
    add_intrinsic2(ctx, fn, f3, f2, f2x3);
    add_intrinsic2(ctx, fn, f4, f2, f2x4);
    add_intrinsic2(ctx, fn, f1, f3, f3x1);
    add_intrinsic2(ctx, fn, f2, f3, f3x2);
    add_intrinsic2(ctx, fn, f3, f3, f3x3);
    add_intrinsic2(ctx, fn, f4, f3, f3x4);
    add_intrinsic2(ctx, fn, f1, f4, f4x1);
    add_intrinsic2(ctx, fn, f2, f4, f4x2);
    add_intrinsic2(ctx, fn, f3, f4, f4x3);
    add_intrinsic2(ctx, fn, f4, f4, f4x4);

    // matrix * scalar
    ADD_INTRINSIC_MATRIX_INT(add_intrinsic2(ctx, fn, dt, dt, dti));
    ADD_INTRINSIC_MATRIX_FLOAT(add_intrinsic2(ctx, fn, dt, dt, dtf));

    // matrix * vector
    add_intrinsic2(ctx, fn, i1, i1x1, i1);
    add_intrinsic2(ctx, fn, i1, i1x2, i2);
    add_intrinsic2(ctx, fn, i1, i1x3, i3);
    add_intrinsic2(ctx, fn, i1, i1x4, i4);
    add_intrinsic2(ctx, fn, i2, i2x1, i1);
    add_intrinsic2(ctx, fn, i2, i2x2, i2);
    add_intrinsic2(ctx, fn, i2, i2x3, i3);
    add_intrinsic2(ctx, fn, i2, i2x4, i4);
    add_intrinsic2(ctx, fn, i3, i3x1, i1);
    add_intrinsic2(ctx, fn, i3, i3x2, i2);
    add_intrinsic2(ctx, fn, i3, i3x3, i3);
    add_intrinsic2(ctx, fn, i3, i3x4, i4);
    add_intrinsic2(ctx, fn, i4, i4x1, i1);
    add_intrinsic2(ctx, fn, i4, i4x2, i2);
    add_intrinsic2(ctx, fn, i4, i4x3, i3);
    add_intrinsic2(ctx, fn, i4, i4x4, i4);
    add_intrinsic2(ctx, fn, f1, f1x1, f1);
    add_intrinsic2(ctx, fn, f1, f1x2, f2);
    add_intrinsic2(ctx, fn, f1, f1x3, f3);
    add_intrinsic2(ctx, fn, f1, f1x4, f4);
    add_intrinsic2(ctx, fn, f2, f2x1, f1);
    add_intrinsic2(ctx, fn, f2, f2x2, f2);
    add_intrinsic2(ctx, fn, f2, f2x3, f3);
    add_intrinsic2(ctx, fn, f2, f2x4, f4);
    add_intrinsic2(ctx, fn, f3, f3x1, f1);
    add_intrinsic2(ctx, fn, f3, f3x2, f2);
    add_intrinsic2(ctx, fn, f3, f3x3, f3);
    add_intrinsic2(ctx, fn, f3, f3x4, f4);
    add_intrinsic2(ctx, fn, f4, f4x1, f1);
    add_intrinsic2(ctx, fn, f4, f4x2, f2);
    add_intrinsic2(ctx, fn, f4, f4x3, f3);
    add_intrinsic2(ctx, fn, f4, f4x4, f4);

    // matrix * matrix
    add_intrinsic2(ctx, fn, i1x1, i1x1, i1x1);
    add_intrinsic2(ctx, fn, i1x2, i1x1, i1x2);
    add_intrinsic2(ctx, fn, i1x3, i1x1, i1x3);
    add_intrinsic2(ctx, fn, i1x4, i1x1, i1x4);
    add_intrinsic2(ctx, fn, i1x1, i1x2, i2x1);
    add_intrinsic2(ctx, fn, i1x2, i1x2, i2x2);
    add_intrinsic2(ctx, fn, i1x3, i1x2, i2x3);
    add_intrinsic2(ctx, fn, i1x4, i1x2, i2x4);
    add_intrinsic2(ctx, fn, i1x1, i1x3, i3x1);
    add_intrinsic2(ctx, fn, i1x2, i1x3, i3x2);
    add_intrinsic2(ctx, fn, i1x3, i1x3, i3x3);
    add_intrinsic2(ctx, fn, i1x4, i1x3, i3x4);
    add_intrinsic2(ctx, fn, i1x1, i1x4, i4x1);
    add_intrinsic2(ctx, fn, i1x2, i1x4, i4x2);
    add_intrinsic2(ctx, fn, i1x3, i1x4, i4x3);
    add_intrinsic2(ctx, fn, i1x4, i1x4, i4x4);
    add_intrinsic2(ctx, fn, i2x1, i2x1, i1x1);
    add_intrinsic2(ctx, fn, i2x2, i2x1, i1x2);
    add_intrinsic2(ctx, fn, i2x3, i2x1, i1x3);
    add_intrinsic2(ctx, fn, i2x4, i2x1, i1x4);
    add_intrinsic2(ctx, fn, i2x1, i2x2, i2x1);
    add_intrinsic2(ctx, fn, i2x2, i2x2, i2x2);
    add_intrinsic2(ctx, fn, i2x3, i2x2, i2x3);
    add_intrinsic2(ctx, fn, i2x4, i2x2, i2x4);
    add_intrinsic2(ctx, fn, i2x1, i2x3, i3x1);
    add_intrinsic2(ctx, fn, i2x2, i2x3, i3x2);
    add_intrinsic2(ctx, fn, i2x3, i2x3, i3x3);
    add_intrinsic2(ctx, fn, i2x4, i2x3, i3x4);
    add_intrinsic2(ctx, fn, i2x1, i2x4, i4x1);
    add_intrinsic2(ctx, fn, i2x2, i2x4, i4x2);
    add_intrinsic2(ctx, fn, i2x3, i2x4, i4x3);
    add_intrinsic2(ctx, fn, i2x4, i2x4, i4x4);
    add_intrinsic2(ctx, fn, i3x1, i3x1, i1x1);
    add_intrinsic2(ctx, fn, i3x2, i3x1, i1x2);
    add_intrinsic2(ctx, fn, i3x3, i3x1, i1x3);
    add_intrinsic2(ctx, fn, i3x4, i3x1, i1x4);
    add_intrinsic2(ctx, fn, i3x1, i3x2, i2x1);
    add_intrinsic2(ctx, fn, i3x2, i3x2, i2x2);
    add_intrinsic2(ctx, fn, i3x3, i3x2, i2x3);
    add_intrinsic2(ctx, fn, i3x4, i3x2, i2x4);
    add_intrinsic2(ctx, fn, i3x1, i3x3, i3x1);
    add_intrinsic2(ctx, fn, i3x2, i3x3, i3x2);
    add_intrinsic2(ctx, fn, i3x3, i3x3, i3x3);
    add_intrinsic2(ctx, fn, i3x4, i3x3, i3x4);
    add_intrinsic2(ctx, fn, i3x1, i3x4, i4x1);
    add_intrinsic2(ctx, fn, i3x2, i3x4, i4x2);
    add_intrinsic2(ctx, fn, i3x3, i3x4, i4x3);
    add_intrinsic2(ctx, fn, i3x4, i3x4, i4x4);
    add_intrinsic2(ctx, fn, i4x1, i4x1, i1x1);
    add_intrinsic2(ctx, fn, i4x2, i4x1, i1x2);
    add_intrinsic2(ctx, fn, i4x3, i4x1, i1x3);
    add_intrinsic2(ctx, fn, i4x4, i4x1, i1x4);
    add_intrinsic2(ctx, fn, i4x1, i4x2, i2x1);
    add_intrinsic2(ctx, fn, i4x2, i4x2, i2x2);
    add_intrinsic2(ctx, fn, i4x3, i4x2, i2x3);
    add_intrinsic2(ctx, fn, i4x4, i4x2, i2x4);
    add_intrinsic2(ctx, fn, i4x1, i4x3, i3x1);
    add_intrinsic2(ctx, fn, i4x2, i4x3, i3x2);
    add_intrinsic2(ctx, fn, i4x3, i4x3, i3x3);
    add_intrinsic2(ctx, fn, i4x4, i4x3, i3x4);
    add_intrinsic2(ctx, fn, i4x1, i4x4, i4x1);
    add_intrinsic2(ctx, fn, i4x2, i4x4, i4x2);
    add_intrinsic2(ctx, fn, i4x3, i4x4, i4x3);
    add_intrinsic2(ctx, fn, i4x4, i4x4, i4x4);
    add_intrinsic2(ctx, fn, f1x1, f1x1, f1x1);
    add_intrinsic2(ctx, fn, f1x2, f1x1, f1x2);
    add_intrinsic2(ctx, fn, f1x3, f1x1, f1x3);
    add_intrinsic2(ctx, fn, f1x4, f1x1, f1x4);
    add_intrinsic2(ctx, fn, f1x1, f1x2, f2x1);
    add_intrinsic2(ctx, fn, f1x2, f1x2, f2x2);
    add_intrinsic2(ctx, fn, f1x3, f1x2, f2x3);
    add_intrinsic2(ctx, fn, f1x4, f1x2, f2x4);
    add_intrinsic2(ctx, fn, f1x1, f1x3, f3x1);
    add_intrinsic2(ctx, fn, f1x2, f1x3, f3x2);
    add_intrinsic2(ctx, fn, f1x3, f1x3, f3x3);
    add_intrinsic2(ctx, fn, f1x4, f1x3, f3x4);
    add_intrinsic2(ctx, fn, f1x1, f1x4, f4x1);
    add_intrinsic2(ctx, fn, f1x2, f1x4, f4x2);
    add_intrinsic2(ctx, fn, f1x3, f1x4, f4x3);
    add_intrinsic2(ctx, fn, f1x4, f1x4, f4x4);
    add_intrinsic2(ctx, fn, f2x1, f2x1, f1x1);
    add_intrinsic2(ctx, fn, f2x2, f2x1, f1x2);
    add_intrinsic2(ctx, fn, f2x3, f2x1, f1x3);
    add_intrinsic2(ctx, fn, f2x4, f2x1, f1x4);
    add_intrinsic2(ctx, fn, f2x1, f2x2, f2x1);
    add_intrinsic2(ctx, fn, f2x2, f2x2, f2x2);
    add_intrinsic2(ctx, fn, f2x3, f2x2, f2x3);
    add_intrinsic2(ctx, fn, f2x4, f2x2, f2x4);
    add_intrinsic2(ctx, fn, f2x1, f2x3, f3x1);
    add_intrinsic2(ctx, fn, f2x2, f2x3, f3x2);
    add_intrinsic2(ctx, fn, f2x3, f2x3, f3x3);
    add_intrinsic2(ctx, fn, f2x4, f2x3, f3x4);
    add_intrinsic2(ctx, fn, f2x1, f2x4, f4x1);
    add_intrinsic2(ctx, fn, f2x2, f2x4, f4x2);
    add_intrinsic2(ctx, fn, f2x3, f2x4, f4x3);
    add_intrinsic2(ctx, fn, f2x4, f2x4, f4x4);
    add_intrinsic2(ctx, fn, f3x1, f3x1, f1x1);
    add_intrinsic2(ctx, fn, f3x2, f3x1, f1x2);
    add_intrinsic2(ctx, fn, f3x3, f3x1, f1x3);
    add_intrinsic2(ctx, fn, f3x4, f3x1, f1x4);
    add_intrinsic2(ctx, fn, f3x1, f3x2, f2x1);
    add_intrinsic2(ctx, fn, f3x2, f3x2, f2x2);
    add_intrinsic2(ctx, fn, f3x3, f3x2, f2x3);
    add_intrinsic2(ctx, fn, f3x4, f3x2, f2x4);
    add_intrinsic2(ctx, fn, f3x1, f3x3, f3x1);
    add_intrinsic2(ctx, fn, f3x2, f3x3, f3x2);
    add_intrinsic2(ctx, fn, f3x3, f3x3, f3x3);
    add_intrinsic2(ctx, fn, f3x4, f3x3, f3x4);
    add_intrinsic2(ctx, fn, f3x1, f3x4, f4x1);
    add_intrinsic2(ctx, fn, f3x2, f3x4, f4x2);
    add_intrinsic2(ctx, fn, f3x3, f3x4, f4x3);
    add_intrinsic2(ctx, fn, f3x4, f3x4, f4x4);
    add_intrinsic2(ctx, fn, f4x1, f4x1, f1x1);
    add_intrinsic2(ctx, fn, f4x2, f4x1, f1x2);
    add_intrinsic2(ctx, fn, f4x3, f4x1, f1x3);
    add_intrinsic2(ctx, fn, f4x4, f4x1, f1x4);
    add_intrinsic2(ctx, fn, f4x1, f4x2, f2x1);
    add_intrinsic2(ctx, fn, f4x2, f4x2, f2x2);
    add_intrinsic2(ctx, fn, f4x3, f4x2, f2x3);
    add_intrinsic2(ctx, fn, f4x4, f4x2, f2x4);
    add_intrinsic2(ctx, fn, f4x1, f4x3, f3x1);
    add_intrinsic2(ctx, fn, f4x2, f4x3, f3x2);
    add_intrinsic2(ctx, fn, f4x3, f4x3, f3x3);
    add_intrinsic2(ctx, fn, f4x4, f4x3, f3x4);
    add_intrinsic2(ctx, fn, f4x1, f4x4, f4x1);
    add_intrinsic2(ctx, fn, f4x2, f4x4, f4x2);
    add_intrinsic2(ctx, fn, f4x3, f4x4, f4x3);
    add_intrinsic2(ctx, fn, f4x4, f4x4, f4x4);
}